

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KBO.cpp
# Opt level: O0

Result __thiscall Kernel::KBO::compare(KBO *this,AppliedTerm tl1,AppliedTerm tl2)

{
  AppliedTerm other;
  AppliedTerm tl1_00;
  AppliedTerm tl2_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Term *this_00;
  Term *this_01;
  pointer this_02;
  EVP_PKEY_CTX *in_RSI;
  SubstApplicator in_stack_00000020;
  unique_ptr<Kernel::KBO::State,_std::default_delete<Kernel::KBO::State>_> *in_stack_00000028;
  Result res;
  State *state;
  Term *t2;
  Term *t1;
  KBO *in_stack_000001e8;
  State *in_stack_000001f0;
  AppliedTerm in_stack_00000200;
  AppliedTerm in_stack_00000218;
  AppliedTerm *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  SubstApplicator *pSVar4;
  KBO *in_stack_ffffffffffffff98;
  State *in_stack_ffffffffffffffa0;
  Result local_54;
  AppliedTerm *in_stack_ffffffffffffffc0;
  TermList in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  Result local_4;
  
  pSVar4 = &stack0x00000020;
  other._8_4_ = in_stack_ffffffffffffff28;
  other.term._content = in_stack_ffffffffffffff20;
  other._12_4_ = in_stack_ffffffffffffff2c;
  other.applicator = pSVar4;
  bVar1 = AppliedTerm::equalsShallow(in_stack_ffffffffffffff10,other);
  if (bVar1) {
    local_4 = EQUAL;
  }
  else {
    bVar1 = TermList::isVar((TermList *)in_stack_00000028);
    if (bVar1) {
      bVar1 = AppliedTerm::containsVar(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
      local_4 = INCOMPARABLE;
      if (bVar1) {
        local_4 = LESS;
      }
    }
    else {
      bVar1 = TermList::isVar((TermList *)in_stack_00000028);
      if (bVar1) {
        bVar1 = AppliedTerm::containsVar
                          (in_stack_ffffffffffffffc0,(TermList)pSVar4->_vptr_SubstApplicator);
        local_4 = INCOMPARABLE;
        if (bVar1) {
          local_4 = GREATER;
        }
      }
      else {
        this_00 = TermList::term((TermList *)0x8871a2);
        this_01 = TermList::term((TermList *)0x8871b4);
        this_02 = std::unique_ptr<Kernel::KBO::State,_std::default_delete<Kernel::KBO::State>_>::get
                            (in_stack_00000028);
        State::init(this_02,in_RSI);
        uVar2 = Term::functor(this_00);
        uVar3 = Term::functor(this_01);
        if (uVar2 == uVar3) {
          local_54 = State::traverseLexBidir
                               (in_stack_000001f0,in_stack_000001e8,in_stack_00000200,
                                in_stack_00000218);
        }
        else {
          tl1_00._8_8_ = this_01;
          tl1_00.term._content = (uint64_t)this_02;
          tl1_00.applicator = (SubstApplicator *)this_00;
          tl2_00._8_8_ = in_stack_ffffffffffffffd0;
          tl2_00.term._content = in_stack_ffffffffffffffc8._content;
          tl2_00.applicator = (SubstApplicator *)in_stack_00000020._vptr_SubstApplicator;
          local_54 = State::traverseNonLex<false>
                               (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,tl1_00,tl2_00);
        }
        local_4 = local_54;
      }
    }
  }
  return local_4;
}

Assistant:

Ordering::Result KBO::compare(AppliedTerm tl1, AppliedTerm tl2) const
{
  if(tl1.equalsShallow(tl2)) {
    return EQUAL;
  }
  if(tl1.term.isVar()) {
    return tl2.containsVar(tl1.term) ? LESS : INCOMPARABLE;
  }
  if(tl2.term.isVar()) {
    return tl1.containsVar(tl2.term) ? GREATER : INCOMPARABLE;
  }

  ASS(tl1.term.isTerm());
  ASS(tl2.term.isTerm());

  Term* t1=tl1.term.term();
  Term* t2=tl2.term.term();

  ASS(_state);
  State* state = _state.get();
#if VDEBUG
  //this is to make sure _state isn't used while we're using it
  auto __state = std::move(_state);
#endif

  state->init();
  Result res;
  if(t1->functor()==t2->functor()) {
    res = state->traverseLexBidir(*this, tl1, tl2);
  } else {
    res = state->traverseNonLex</*unidirectional=*/false>(*this, tl1, tl2);
  }
#if VDEBUG
  _state = std::move(__state);
#endif
  return res;
}